

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

void __thiscall
PhyloTree::PhyloTree(PhyloTree *this,PhyloTree *other,vector<int,_std::allocator<int>_> *missing)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  ulong uVar1;
  __node_base _Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  bool bVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  long *index_end;
  size_type num_bits;
  __node_base _Var14;
  pointer pbVar15;
  ulong uVar16;
  mapped_type mVar17;
  pointer this_00;
  long lVar18;
  double dVar19;
  EdgeInfo info;
  bitset_t pruned;
  vector<double,_std::allocator<double>_> pruned_lengths;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>_>
  hashmap;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  name_indices;
  undefined1 local_1e0 [8];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1d8;
  int local_1b8;
  bool local_1b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  bitset_t *local_198;
  PhyloTree *local_190;
  _func_int **local_188;
  string local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  vector<double,_std::allocator<double>_> *local_158;
  pointer local_150;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_148;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Stack_140;
  undefined8 local_138;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_120;
  bitset_t local_e8;
  bitset_t local_c8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  bitset_t local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_128 = &(this->newick).field_2;
  (this->newick)._M_dataplus._M_p = (pointer)local_128;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  local_130 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&this->edges;
  local_160 = &this->leaf2NumMap;
  local_158 = &this->leafEdgeLengths;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = 0;
  local_148._M_current = (double *)0x0;
  _Stack_140._M_current = (double *)0x0;
  local_198 = (bitset_t *)missing;
  local_190 = this;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (other->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (missing->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_160);
  index_end = (long *)(((_Vector_base<int,_std::allocator<int>_> *)&local_198->m_bits)->_M_impl).
                      super__Vector_impl_data._M_finish;
  Tools::
  prune_container<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (other->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             (((_Vector_base<int,_std::allocator<int>_> *)&local_198->m_bits)->_M_impl).
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)index_end,
             (vector<double,_std::allocator<double>_> *)&local_148);
  local_1e0 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_158,
             (long)(local_190->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_190->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(value_type_conflict *)local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - pruned_names",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((local_190->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (local_190->leaf2NumMap).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - pruned_lengths",0x16);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  Tools::
  vector_print<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (local_148,_Stack_140);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pbVar15 = (local_190->leaf2NumMap).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_190->leaf2NumMap).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar15) {
    lVar18 = 0;
    mVar17 = 0;
    do {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_68,(key_type *)((long)&(pbVar15->_M_dataplus)._M_p + lVar18));
      *pmVar6 = mVar17;
      mVar17 = mVar17 + 1;
      pbVar15 = (local_190->leaf2NumMap).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = lVar18 + 0x20;
    } while (mVar17 < (ulong)((long)(local_190->leaf2NumMap).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5)
            );
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DEBUG - name_indices",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  for (_Var2._M_nxt = local_68._M_before_begin._M_nxt; _Var2._M_nxt != (_Hash_node_base *)0x0;
      _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)_Var2._M_nxt[1]._M_nxt,
                        (long)_Var2._M_nxt[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  local_120._M_buckets = &local_120._M_single_bucket;
  local_120._M_bucket_count = 1;
  local_120._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_120._M_element_count = 0;
  local_120._M_rehash_policy._M_max_load_factor = 1.0;
  local_120._M_rehash_policy._M_next_resize = 0;
  local_120._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  local_150 = (other->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_150) {
    local_188 = (_func_int **)((ulong)local_188 & 0xffffffff00000000);
    do {
      Bipartition::getPartition
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,
                 &this_00->super_Bipartition);
      Tools::prune_bitset<std::vector<int,std::allocator<int>>>
                ((bitset_t *)&local_180,(Tools *)local_1e0,local_198,
                 (vector<int,_std::allocator<int>_> *)index_end);
      bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_1e0);
      if (!bVar4) goto LAB_001232d1;
      if (local_1e0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"DEBUG - edge = ",0xf);
      (**(this_00->super_Bipartition)._vptr_Bipartition)
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,this_00)
      ;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_1e0,
                          (long)local_1d8.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," pruned = ",10);
      pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar7,
                                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_180);
      std::ios::widen((char)*(undefined8 *)(*(long *)pbVar8 + -0x18) + (char)pbVar8);
      std::ostream::put((char)pbVar8);
      std::ostream::flush();
      if (local_1e0 != (undefined1  [8])(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0);
      }
      iVar9 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_120,(key_type *)&local_180);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
        iVar9 = std::
                _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_120,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0);
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_1e0);
        if (!bVar4) goto LAB_001232d1;
        if (local_1e0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1e0);
        }
        if (iVar9.
            super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_1e0 = (undefined1  [8])0x0;
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)(local_1e0 + 0x18);
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_1b8 = 0;
          local_1b4 = false;
          local_1e0 = (undefined1  [8])PhyloTreeEdge::getLength(this_00);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_c8.m_bits,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
          local_c8.m_num_bits = local_180.field_2._8_8_;
          bVar4 = Tools::is_leaf(&local_c8);
          bVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_c8);
          if (!bVar5) goto LAB_001232d1;
          if (local_c8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar4) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_e8.m_bits,
                       (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
            local_e8.m_num_bits = local_180.field_2._8_8_;
            sVar11 = Tools::leaf_index_nothrow(&local_e8);
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_e8);
            if (!bVar4) goto LAB_001232d1;
            if (local_e8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_e8.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            std::__cxx11::string::_M_assign((string *)(local_1e0 + 8));
            local_1e0 = (undefined1  [8])(local_148._M_current[sVar11] + (double)local_1e0);
            local_1b4 = true;
          }
          else {
            local_1b8 = (int)local_188;
            local_188 = (_func_int **)CONCAT44(local_188._4_4_,(int)local_188 + 1);
          }
          pmVar10 = std::__detail::
                    _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_120,(key_type *)&local_180);
          pmVar10->length = (double)local_1e0;
          std::__cxx11::string::_M_assign((string *)&pmVar10->name);
          pmVar10->leaf = local_1b4;
          pmVar10->id = local_1b8;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DEBUG - adding hashmap[",0x17);
          pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)&local_180);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,"] = {",5);
          poVar7 = std::ostream::_M_insert<double>((double)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_1d8.m_bits.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1d8.m_bits.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
          index_end = &std::cout;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          if (local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)(local_1e0 + 0x18)) {
            operator_delete(local_1d8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
          pmVar10 = std::__detail::
                    _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_120,
                                 (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 local_1e0);
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_1e0);
          if (!bVar4) goto LAB_001232d1;
          if (local_1e0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1e0);
          }
          dVar19 = PhyloTreeEdge::getLength(this_00);
          pmVar10->length = dVar19 + pmVar10->length;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DEBUG - altering hashmap[",0x19);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,
                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
          pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,"] = {",5);
          poVar7 = std::ostream::_M_insert<double>(pmVar10->length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(pmVar10->name)._M_dataplus._M_p,
                              (pmVar10->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pmVar10->id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"} (complement)",0xe);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)local_1e0);
          if (!bVar4) goto LAB_001232d1;
          if (local_1e0 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1e0);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
          index_end = &std::cout;
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
        }
      }
      else {
        pmVar10 = std::__detail::
                  _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&local_120,(key_type *)&local_180);
        dVar19 = PhyloTreeEdge::getLength(this_00);
        pmVar10->length = dVar19 + pmVar10->length;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DEBUG - altering hashmap[",0x19);
        pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &local_180);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,"] = {",5);
        poVar7 = std::ostream::_M_insert<double>(pmVar10->length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(pmVar10->name)._M_dataplus._M_p,(pmVar10->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pmVar10->id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
        index_end = &std::cout;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_180);
      if (!bVar4) goto LAB_001232d1;
      if (local_180._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_150);
  }
  lVar18 = (long)(local_190->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_190->leaf2NumMap).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    num_bits = lVar18 >> 5;
    local_198 = (bitset_t *)(num_bits + (num_bits == 0));
    lVar18 = -1;
    do {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180,
                 num_bits,0,(allocator<unsigned_long> *)local_1e0);
      *(ulong *)(local_180._M_dataplus._M_p + (num_bits + lVar18 >> 6) * 8) =
           *(ulong *)(local_180._M_dataplus._M_p + (num_bits + lVar18 >> 6) * 8) |
           1L << ((byte)(num_bits + lVar18) & 0x3f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_88.m_bits,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
      local_88.m_num_bits = local_180.field_2._8_8_;
      sVar11 = Tools::leaf_index_nothrow(&local_88);
      bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants(&local_88);
      if (!bVar4) goto LAB_001232d1;
      if (local_88.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.m_bits.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar9 = std::
              _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&local_120,(key_type *)&local_180);
      if (iVar9.
          super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
          ._M_cur == (__node_type *)0x0) {
        boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                  ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0,
                   (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_180);
        iVar9 = std::
                _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_120,
                       (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_1e0);
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   local_1e0);
        if (!bVar4) goto LAB_001232d1;
        if (local_1e0 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1e0);
        }
        if (iVar9.
            super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_1e0 = (undefined1  [8])0x0;
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)(local_1e0 + 0x18);
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          local_1b8 = 0;
          local_1b4 = false;
          std::__cxx11::string::_M_assign((string *)(local_1e0 + 8));
          local_1e0 = (undefined1  [8])local_148._M_current[sVar11];
          local_1b4 = true;
          pmVar10 = std::__detail::
                    _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&local_120,(key_type *)&local_180);
          pmVar10->length = (double)local_1e0;
          std::__cxx11::string::_M_assign((string *)&pmVar10->name);
          pmVar10->leaf = local_1b4;
          pmVar10->id = local_1b8;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"DEBUG - adding leaf hashmap[",0x1c);
          pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                                     (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>
                                      *)&local_180);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,"] = {",5);
          poVar7 = std::ostream::_M_insert<double>((double)local_1e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)local_1d8.m_bits.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1d8.m_bits.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          if (local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)(local_1e0 + 0x18)) {
            operator_delete(local_1d8.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
              m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &local_180);
      if (!bVar4) goto LAB_001232d1;
      if (local_180._M_dataplus._M_p != (char *)0x0) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      lVar12 = (long)&(((_Vector_base<int,_std::allocator<int>_> *)&local_198->m_bits)->_M_impl).
                      super__Vector_impl_data._M_start + lVar18;
      lVar18 = lVar18 + -1;
    } while (lVar12 != 0);
  }
  if (local_120._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    local_150 = (pointer)&PTR_toString_abi_cxx11__0013eb00;
    local_188 = (_func_int **)&PTR_toString_abi_cxx11__0013ea08;
    _Var14._M_nxt = local_120._M_before_begin._M_nxt;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"DEBUG - hashmap key: ",0x15);
      b = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(_Var14._M_nxt + 1);
      pbVar8 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pbVar8,", value: {",10);
      poVar7 = std::ostream::_M_insert<double>((double)_Var14._M_nxt[5]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)_Var14._M_nxt[6]._M_nxt,(long)_Var14._M_nxt[7]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,*(int *)&_Var14._M_nxt[10]._M_nxt);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
      poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (*(char *)((long)&_Var14._M_nxt[10]._M_nxt + 4) == '\x01') {
        local_198 = (bitset_t *)_Var14._M_nxt[5]._M_nxt;
        pmVar6 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,(key_type *)(_Var14._M_nxt + 6));
        (local_158->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[*pmVar6] = (double)local_198;
      }
      else {
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all(b);
        if (!bVar4) {
          p_Var3 = _Var14._M_nxt[1]._M_nxt;
          lVar18 = (long)_Var14._M_nxt[2]._M_nxt - (long)p_Var3;
          if (lVar18 != 0) {
            uVar13 = lVar18 >> 3;
            if (p_Var3->_M_nxt == (_Hash_node_base *)0x0) {
              uVar16 = 0;
              do {
                if ((uVar13 + (uVar13 == 0)) - 1 == uVar16) goto LAB_001230a2;
                uVar1 = uVar16 + 1;
                lVar18 = uVar16 + 1;
                uVar16 = uVar1;
              } while (p_Var3[lVar18]._M_nxt == (_Hash_node_base *)0x0);
              if (uVar13 <= uVar1) goto LAB_001230a2;
            }
            std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
            emplace_back<boost::dynamic_bitset<unsigned_long,std::allocator<unsigned_long>>const&,double&,int&>
                      (local_130,b,(double *)(_Var14._M_nxt + 5),(int *)(_Var14._M_nxt + 10));
          }
        }
LAB_001230a2:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"DEBUG - PhyloTreeEdge check",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_a8.m_bits,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)b);
        local_a8.m_num_bits = (size_type)_Var14._M_nxt[4]._M_nxt;
        PhyloTreeEdge::PhyloTreeEdge
                  ((PhyloTreeEdge *)local_1e0,&local_a8,(double)_Var14._M_nxt[5]._M_nxt,
                   *(int *)&_Var14._M_nxt[10]._M_nxt);
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants(&local_a8);
        if (!bVar4) {
LAB_001232d1:
          __assert_fail("m_check_invariants()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                        ,0x279,
                        "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                       );
        }
        if (local_a8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        PhyloTreeEdge::toString_abi_cxx11_(&local_180,(PhyloTreeEdge *)local_1e0);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_180._M_dataplus._M_p,
                            local_180._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        dVar19 = PhyloTreeEdge::getLength((PhyloTreeEdge *)local_1e0);
        poVar7 = std::ostream::_M_insert<double>(dVar19);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DEBUG end",9);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
        local_1e0 = (undefined1  [8])local_150;
        if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
        }
        local_1e0 = (undefined1  [8])local_188;
        bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                m_check_invariants((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (local_1e0 + 8));
        if (!bVar4) goto LAB_001232d1;
        if (local_1d8.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d8.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeInfo>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_120);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_148._M_current != (double *)0x0) {
    operator_delete(local_148._M_current);
  }
  return;
}

Assistant:

PhyloTree::PhyloTree(const PhyloTree& other, const vector<int>& missing)
{
    vector<double> pruned_lengths;  // temp store relevant edge lengths from other tree

    // TODO: combine these into a single loop
    Tools::prune_container(other.leaf2NumMap.begin(), other.leaf2NumMap.end(),
            missing.begin(), missing.end(), std::back_inserter(this->leaf2NumMap)); // fill pruned leaf2NumMap
    Tools::prune_container(other.leafEdgeLengths.begin(), other.leafEdgeLengths.end(),
            missing.begin(), missing.end(), std::back_inserter(pruned_lengths)); // fill temp lengths store

    this->leafEdgeLengths.resize(this->leaf2NumMap.size(), 0); // initialise leaf lengths vector

#ifdef DEBUGPRINT
    cout << "DEBUG - pruned_names" << endl;
    Tools::vector_print(this->leaf2NumMap.begin(), this->leaf2NumMap.end());

    cout << "DEBUG - pruned_lengths" << endl;
    Tools::vector_print(pruned_lengths.begin(), pruned_lengths.end());
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<string, size_t> name_indices;
    for (size_t i = 0; i<this->leaf2NumMap.size(); i++) {
        name_indices[this->leaf2NumMap[i]] = i;
    }
#ifdef DEBUGPRINT
    cout << "DEBUG - name_indices" << endl;
    for (auto& item: name_indices) {
        cout << item.first << " " << item.second << endl;
    }
    cout << "DEBUG end" << endl;
#endif

    std::unordered_map<bitset_t, EdgeInfo, BitsetHash> hashmap;
    int inner_edge_counter = 0;
    for (auto& edge: other.edges) {
        auto pruned = Tools::prune_bitset(edge.getPartition(), missing);

#ifdef DEBUGPRINT
        auto edge_copy = &edge;
        cout << "DEBUG - edge = " << const_cast<PhyloTreeEdge*>(edge_copy)->toString() << " pruned = " << pruned
                << endl;
#endif


        if (hashmap.find(pruned)==hashmap.end()) {
            if (hashmap.find(~pruned)==hashmap.end()) {
                EdgeInfo info;
                info.length = edge.getLength();
                if (Tools::is_leaf(pruned)) {
                    size_t ix = Tools::leaf_index_nothrow(pruned);
                    info.name = this->leaf2NumMap[ix];
                    info.length += pruned_lengths[ix];
                    info.leaf = true;
                }
                else {
                    info.id = inner_edge_counter++;
                }
                hashmap[pruned] = info;
#ifdef DEBUGPRINT
                cout << "DEBUG - adding hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "}" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
            else {
                auto& info = hashmap[~pruned];
                info.length += edge.getLength();
#ifdef DEBUGPRINT
                cout << "DEBUG - altering hashmap[" << ~pruned << "] = {" << info.length << ", " << info.name
                        << ", " << info.id << ", " << info.leaf << "} (complement)" << endl;
                cout << "DEBUG end" << endl;
#endif
            }
        }
        else {
            auto& info = hashmap[pruned];
            info.length += edge.getLength();
#ifdef DEBUGPRINT
            cout << "DEBUG - altering hashmap[" << pruned << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
    // Add remaining leaves
    size_t size = this->leaf2NumMap.size();
    for (size_t i=0; i < size; ++i) {
        bitset_t leaf_split(size);
        leaf_split[size - i - 1] = true;
        size_t index = Tools::leaf_index_nothrow(leaf_split);
        if (hashmap.find(leaf_split)==hashmap.end() && hashmap.find(~leaf_split)==hashmap.end()) {
            EdgeInfo info;
            info.name = this->leaf2NumMap[index];
            info.length = pruned_lengths[index];
            info.leaf = true;
            hashmap[leaf_split] = info;
#ifdef DEBUGPRINT
            cout << "DEBUG - adding leaf hashmap[" << leaf_split << "] = {" << info.length << ", " << info.name
                    << ", " << info.id << ", " << info.leaf << "}" << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }

    // All info to build this PhyloTree is in the hashmap
    for (auto& item : hashmap) {
#ifdef DEBUGPRINT
        cout << "DEBUG - hashmap key: " << item.first << ", value: {" << item.second.length << ", " << item.second.name
                << ", " << item.second.id << ", " << item.second.leaf << "}" << endl;
#endif
        if (item.second.leaf) {
            this->leafEdgeLengths[name_indices[item.second.name]] = item.second.length;
        }
        else {
            if (!item.first.all() && !item.first.none()) {
                this->edges.emplace_back(item.first, item.second.length, item.second.id);
            }
#ifdef DEBUGPRINT
            cout << "DEBUG - PhyloTreeEdge check" << endl;
            PhyloTreeEdge check(item.first, item.second.length, item.second.id);
            cout << check.toString() << " " << check.getLength() << endl;
            cout << "DEBUG end" << endl;
#endif
        }
    }
}